

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::FunctionPortSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,FunctionPortSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (FunctionPortSyntax *)0x0:
    return __return_storage_ptr__ + 2;
  case (FunctionPortSyntax *)0x1:
    pPVar1 = __return_storage_ptr__ + 5;
    break;
  case (FunctionPortSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 6;
    break;
  case (FunctionPortSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 7;
    break;
  case (FunctionPortSyntax *)0x4:
    pPVar1 = __return_storage_ptr__ + 8;
    break;
  case (FunctionPortSyntax *)0x5:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[9].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  case (FunctionPortSyntax *)0x6:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[9].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax FunctionPortSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &constKeyword;
        case 2: return &direction;
        case 3: return &staticKeyword;
        case 4: return &varKeyword;
        case 5: return dataType;
        case 6: return declarator.get();
        default: return nullptr;
    }
}